

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

void __thiscall minihttp::HttpSocket::_ParseHeaderFields(HttpSocket *this,char *s,size_t size)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  char *pcVar8;
  char *pcVar9;
  string key;
  string valstr;
  key_type local_78;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (0 < (long)size) {
    local_58 = s + size;
    pcVar4 = local_58;
    do {
      while (iVar3 = isspace((int)*s), iVar3 == 0) {
        pcVar4 = strchr(s,0x3a);
        if (pcVar4 == (char *)0x0) {
          return;
        }
        pcVar5 = strchr(pcVar4,10);
        pcVar8 = pcVar5;
        if (pcVar5 == (char *)0x0) {
          return;
        }
        for (; (pcVar5[-1] == '\n' || (pcVar9 = pcVar4, pcVar5[-1] == '\r')); pcVar5 = pcVar5 + -1)
        {
          pcVar8 = pcVar8 + -1;
        }
        do {
          pcVar9 = pcVar9 + 1;
          iVar3 = isspace((int)*pcVar9);
          if (pcVar5 <= pcVar9) break;
        } while (iVar3 != 0);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,s,pcVar4);
        sVar2 = local_78._M_string_length;
        _Var1._M_p = local_78._M_dataplus._M_p;
        if (local_78._M_string_length != 0) {
          sVar7 = 0;
          do {
            iVar3 = tolower((int)_Var1._M_p[sVar7]);
            _Var1._M_p[sVar7] = (char)iVar3;
            sVar7 = sVar7 + 1;
          } while (sVar2 != sVar7);
        }
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar9,pcVar8);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->_hdrs,&local_78);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pcVar4 = local_58;
        s = pcVar5;
        if (local_58 <= pcVar5) {
          return;
        }
      }
      s = s + 1;
    } while (s < pcVar4);
  }
  return;
}

Assistant:

void HttpSocket::_ParseHeaderFields(const char *s, size_t size)
{
    // Key: Value data\r\n

    const char * const maxs = s + size;
    while(s < maxs)
    {
        while(isspace(*s))
        {
            ++s;
            if(s >= maxs)
                return;
        }
        const char * const colon = strchr(s, ':');
        if(!colon)
            return;
        const char *valEnd = strchr(colon, '\n'); // last char of val data
        if(!valEnd)
            return;
        while(valEnd[-1] == '\n' || valEnd[-1] == '\r') // skip backwards if necessary
            --valEnd;
        const char *val = colon + 1; // value starts after ':' ...
        while(isspace(*val) && val < valEnd) // skip spaces after the colon
            ++val;
        std::string key(s, colon - s);
        strToLower(key);
        std::string valstr(val, valEnd - val);
        _hdrs[key] = valstr;
        traceprint("HDR: %s: %s\n", key.c_str(), valstr.c_str());
        s = valEnd;
    }
}